

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-desc.c
# Opt level: O2

size_t object_desc(char *buf,size_t max,object *obj,uint32_t mode,player *p)

{
  short sVar1;
  player *p_00;
  undefined4 uVar2;
  size_t max_00;
  _Bool _Var3;
  _Bool _Var4;
  char cVar5;
  int16_t iVar6;
  wchar_t wVar7;
  wchar_t wVar8;
  wchar_t wVar9;
  size_t sVar10;
  undefined7 extraout_var;
  object_kind *poVar11;
  object *poVar12;
  object *poVar13;
  long lVar14;
  char *pcVar15;
  uint uVar16;
  player *ppVar17;
  byte bVar18;
  uint uVar19;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  char *pcVar23;
  char **end;
  bool bVar24;
  char *local_c0;
  char *local_a0;
  player *local_98;
  undefined4 local_90;
  undefined4 local_8c;
  char *local_88 [8];
  undefined4 local_48;
  size_t local_38;
  
  if ((obj == (object *)0x0) || (obj->known == (object *)0x0)) {
    pcVar15 = "(nothing)";
LAB_001826fe:
    sVar10 = strnfmt(buf,max,pcVar15);
    return sVar10;
  }
  if (obj->kind != obj->known->kind) {
    if ((mode & 0x40) == 0) {
      pcVar15 = "unknown item";
    }
    else {
      pcVar15 = "an unknown item";
    }
    goto LAB_001826fe;
  }
  _Var3 = tval_is_money(obj);
  if (_Var3) {
    sVar1 = obj->pval;
    pcVar15 = obj->kind->name;
    _Var3 = ignore_item_ok(p,obj);
    pcVar23 = "";
    if (_Var3) {
      pcVar23 = " {ignore}";
    }
    sVar10 = strnfmt(buf,max,"%d gold pieces worth of %s%s",(ulong)(uint)(int)sVar1,pcVar15,pcVar23)
    ;
    return sVar10;
  }
  if (((mode & 0x20) == 0) && (obj->known->ego != (ego_item *)0x0)) {
    obj->ego->everseen = true;
  }
  _Var3 = object_flavor_is_aware(obj);
  if (((mode & 0x20) == 0) && (_Var3)) {
    obj->kind->everseen = true;
  }
  local_a0 = (char *)0x0;
  if ((mode >> 10 & 1) == 0) {
    uVar16 = (uint)obj->number;
  }
  else {
    uVar16 = mode >> 0x10;
  }
  local_98 = p;
  _Var3 = object_flavor_is_aware(obj);
  if (((mode & 0x10) == 0) && (obj->artifact == (artifact *)0x0)) {
    local_8c = CONCAT31((int3)(uVar16 >> 8),(mode & 8) != 0 || uVar16 != 1);
  }
  else {
    local_8c = 0;
  }
  if ((obj->known == (object *)0x0) ||
     (_Var4 = flag_has_dbg(obj->known->flags,6,0x2a,"obj->known->flags","OF_PERFECT_BALANCE"),
     !_Var4)) {
    local_90 = 0;
  }
  else {
    local_90 = (undefined4)CONCAT71(extraout_var,obj->artifact == (artifact *)0x0);
  }
  bVar18 = (byte)((mode & 0x20) >> 5) | _Var3 | (byte)((mode & 4) >> 2);
  _Var3 = false;
  if (((mode >> 8 & 1) == 0) && (_Var3 = true, obj->kind->flavor == (flavor *)0x0)) {
    _Var3 = tval_is_jewelry(obj);
  }
  _Var4 = false;
  if ((mode & 4) == 0) {
    _Var4 = _Var3;
  }
  _Var3 = _Var4;
  if ((bVar18 == 1 && local_98 != (player *)0x0) &&
     (_Var3 = false, (local_98->opts).opt[7] != false)) {
    _Var3 = _Var4;
  }
  local_38 = max;
  if ((obj->artifact != (artifact *)0x0) &&
     (((bVar18 != 0 || (_Var4 = object_is_known_artifact(obj), _Var4 || (mode & 0x100) != 0)) ||
      (obj->kind->flavor == (flavor *)0x0)))) {
    sVar10 = local_38;
    _Var3 = tval_is_wearable(obj);
    poVar13 = obj;
    if (!_Var3) {
      poVar13 = (object *)&obj->kind->base;
    }
    poVar11 = poVar13->kind;
LAB_0018294e:
    local_c0 = poVar11->name;
    goto LAB_00182956;
  }
  pcVar15 = "& Book~ #";
  sVar10 = local_38;
  switch(obj->tval) {
  case '\x01':
  case '\x02':
  case '\x03':
  case '\x04':
  case '\x05':
  case '\x06':
  case '\a':
  case '\b':
  case '\t':
  case '\n':
  case '\v':
  case '\f':
  case '\r':
  case '\x0e':
  case '\x0f':
  case '\x10':
  case '\x11':
  case '\x12':
  case '\x13':
  case '\x1b':
  case '\x1c':
    poVar11 = obj->kind;
    goto LAB_0018294e;
  case '\x14':
    pcVar15 = "& # Amulet~";
    local_c0 = "& Amulet~";
    break;
  case '\x15':
    pcVar15 = "& # Ring~";
    local_c0 = "& Ring~";
    break;
  case '\x16':
    pcVar15 = "& # Sta|ff|ves|";
    local_c0 = "& Sta|ff|ves|";
    break;
  case '\x17':
    pcVar15 = "& # Wand~";
    local_c0 = "& Wand~";
    break;
  case '\x18':
    pcVar15 = "& # Rod~";
    local_c0 = "& Rod~";
    break;
  case '\x19':
    pcVar15 = "& Scroll~ titled #";
    local_c0 = "& Scroll~";
    break;
  case '\x1a':
    pcVar15 = "& # Potion~";
    local_c0 = "& Potion~";
    break;
  case '\x1d':
    pcVar15 = "& # Mushroom~";
    local_c0 = "& Mushroom~";
    break;
  case '\x1e':
    local_c0 = "& Book~ of Magic Spells #";
    goto LAB_001834dc;
  case '\x1f':
    local_c0 = "& Holy Book~ of Prayers #";
    goto LAB_001834dc;
  case ' ':
    local_c0 = "& Book~ of Nature Magics #";
    goto LAB_001834dc;
  case '!':
    pcVar15 = "& Tome~ #";
    local_c0 = "& Necromantic Tome~ #";
    goto LAB_001834dc;
  case '\"':
    local_c0 = "& Book of Mysteries~ #";
LAB_001834dc:
    bVar24 = (mode & 0x100) == 0;
    goto LAB_001834e2;
  default:
    local_c0 = "(nothing)";
    goto LAB_00182956;
  }
  bVar24 = _Var3 == false;
LAB_001834e2:
  if (!bVar24) {
    local_c0 = pcVar15;
  }
LAB_00182956:
  poVar11 = obj->kind;
  _Var3 = tval_can_have_flavor_k(poVar11);
  pcVar15 = "";
  if (_Var3) {
    poVar11 = (object_kind *)poVar11->flavor;
    if (poVar11 != (object_kind *)0x0) {
LAB_00182998:
      pcVar15 = poVar11->name;
    }
  }
  else {
    _Var3 = tval_is_book_k(poVar11);
    if ((_Var3) || (_Var3 = tval_is_jewelry_k(poVar11), _Var3)) goto LAB_00182998;
  }
  uVar2 = local_8c;
  if ((mode & 0x40) == 0) {
    pcVar23 = (char *)0x0;
  }
  else {
    local_88[0] = (char *)0x0;
    if ((short)uVar16 == 1) {
      _Var3 = object_is_known_artifact(obj);
      if (_Var3) {
        pcVar23 = "the ";
        goto LAB_00182a10;
      }
      pcVar23 = local_c0;
      if (*local_c0 != '&') goto LAB_00182a85;
      do {
        cVar5 = pcVar23[1];
        pcVar23 = pcVar23 + 1;
      } while (cVar5 == ' ');
      if (cVar5 == '#') {
        if (pcVar15 != (char *)0x0) {
          cVar5 = *pcVar15;
          goto LAB_00182a6f;
        }
        bVar24 = true;
      }
      else {
LAB_00182a6f:
        _Var3 = is_a_vowel((int)cVar5);
        bVar24 = !_Var3;
      }
      if ((mode >> 8 & 1) == 0) {
        if (bVar24 || (char)local_90 != '\0') {
          pcVar23 = "a ";
        }
        else {
          pcVar23 = "an ";
        }
        goto LAB_00182a10;
      }
    }
    else if (uVar16 == 0) {
      pcVar23 = "no more ";
LAB_00182a10:
      strnfcat(buf,sVar10,(size_t *)local_88,pcVar23);
    }
    else {
      strnfcat(buf,sVar10,(size_t *)local_88,"%u ");
    }
LAB_00182a85:
    pcVar23 = local_88[0];
    if ((char)local_90 != '\0') {
      strnfcat(buf,sVar10,(size_t *)local_88,"well-balanced ");
      pcVar23 = local_88[0];
    }
  }
  local_a0 = (char *)obj_desc_name_format
                               (buf,sVar10,(size_t)pcVar23,local_c0,pcVar15,SUB41(uVar2,0));
  _Var3 = object_is_known_artifact(obj);
  if (_Var3) {
    strnfcat(buf,sVar10,(size_t *)&local_a0," %s");
  }
  else {
    if (((mode >> 9 & 1) == 0 && obj->known->ego != (ego_item *)0x0) ||
       ((mode & 4) != 0 && obj->ego != (ego_item *)0x0)) {
      pcVar15 = " %s";
    }
    else {
      if (((bVar18 == 0) || (obj->artifact != (artifact *)0x0)) ||
         ((obj->kind->flavor == (flavor *)0x0 && (obj->kind->tval != L'\x19')))) goto LAB_00182b84;
      if ((mode >> 8 & 1) == 0) {
        pcVar15 = " of %s";
      }
      else {
        pcVar15 = " \'%s\'";
      }
    }
    strnfcat(buf,sVar10,(size_t *)&local_a0,pcVar15);
  }
LAB_00182b84:
  pcVar15 = local_a0;
  if ((mode & 1) == 0) goto LAB_00182fc4;
  _Var3 = tval_is_chest(obj);
  if (_Var3) {
    local_88[0] = pcVar15;
    _Var3 = tval_is_chest(obj);
    ppVar17 = local_98;
    if ((_Var3) && ((obj->pval == 0 || (obj->known->pval != 0)))) {
      pcVar15 = chest_trap_name(obj);
      strnfcat(buf,sVar10,(size_t *)local_88," (%s)",pcVar15);
      pcVar15 = local_88[0];
    }
  }
  else {
    _Var3 = tval_is_light(obj);
    ppVar17 = local_98;
    if (_Var3) {
      local_88[0] = pcVar15;
      _Var3 = tval_is_light(obj);
      ppVar17 = local_98;
      if ((_Var3) &&
         (_Var3 = flag_has_dbg(obj->flags,6,0x19,"obj->flags","OF_NO_FUEL"), ppVar17 = local_98,
         !_Var3)) {
        strnfcat(buf,sVar10,(size_t *)local_88," (%d turns)",(ulong)(uint)(int)obj->timeout);
        pcVar15 = local_88[0];
      }
    }
  }
  p_00 = player;
  poVar13 = obj->known;
  local_88[0] = pcVar15;
  if ((player->state).shield_on_back == true) {
    wVar7 = slot_by_name(player,"arm");
    poVar12 = slot_object(p_00,wVar7);
    if (poVar12 != poVar13) goto LAB_00182cbf;
    iVar6 = poVar13->ac / 3;
  }
  else {
LAB_00182cbf:
    iVar6 = poVar13->ac;
  }
  _Var3 = flag_has_dbg(poVar13->kind->kind_flags,4,0x16,"obj->kind->kind_flags","KF_SHOW_DICE");
  if ((_Var3) &&
     ((ppVar17 == (player *)0x0 || ((ppVar17->obj_k->dd != '\0' && (ppVar17->obj_k->ds != '\0'))))))
  {
    strnfcat(buf,sVar10,(size_t *)local_88," (%dd%d)",(ulong)poVar13->dd,(ulong)poVar13->ds);
  }
  _Var3 = flag_has_dbg(poVar13->kind->kind_flags,4,0x17,"obj->kind->kind_flags","KF_SHOW_MULT");
  if (_Var3) {
    strnfcat(buf,sVar10,(size_t *)local_88," (x%d)");
  }
  if (((mode & 0x20) == 0) && (pcVar15 = local_88[0], (poVar13->notice & 2) == 0))
  goto LAB_00182fc4;
  wVar7 = object_to_hit(poVar13);
  wVar8 = object_to_dam(poVar13);
  wVar9 = object_to_ac(poVar13);
  if (((ppVar17 != (player *)0x0) && ((ppVar17->obj_k->to_h == 0 || (ppVar17->obj_k->to_d == 0))))
     || (((_Var3 = tval_is_weapon(poVar13), wVar8 == L'\0' && !_Var3 &&
          ((wVar7 == L'\0' || (_Var3 = tval_is_body_armor(poVar13), _Var3)))) &&
         (((_Var3 = object_has_standard_to_h(poVar13), _Var3 && (wVar7 == poVar13->to_h)) ||
          ((poVar13->artifact != (artifact *)0x0 || (poVar13->ego != (ego_item *)0x0)))))))) {
    if ((poVar13->to_h < 0) && (_Var3 = object_has_standard_to_h(poVar13), _Var3)) {
LAB_00182f21:
      strnfcat(buf,sVar10,(size_t *)local_88," (%+d)");
      goto LAB_00182f28;
    }
    if (wVar8 == L'\0') {
      if (wVar7 == L'\0') goto LAB_00182f28;
      if (ppVar17 != (player *)0x0) {
        poVar12 = ppVar17->obj_k;
        goto LAB_00182f03;
      }
      goto LAB_00182f21;
    }
    if ((ppVar17 == (player *)0x0) || (poVar12 = ppVar17->obj_k, poVar12->to_d != 0))
    goto LAB_00182f21;
    if (wVar7 != L'\0') {
LAB_00182f03:
      if (poVar12->to_h != 0) goto LAB_00182f21;
    }
LAB_00182f34:
    if (poVar12->to_a != 0) goto LAB_00182f3b;
    _Var3 = obj_desc_show_armor(poVar13,ppVar17);
    pcVar15 = local_88[0];
    if (!_Var3) goto LAB_00182fc4;
    pcVar15 = " [%d]";
  }
  else {
    strnfcat(buf,sVar10,(size_t *)local_88," (%+d,%+d)",wVar7,(ulong)(uint)wVar8);
LAB_00182f28:
    if (ppVar17 != (player *)0x0) {
      poVar12 = ppVar17->obj_k;
      goto LAB_00182f34;
    }
LAB_00182f3b:
    _Var3 = obj_desc_show_armor(poVar13,ppVar17);
    if (_Var3) {
      strnfcat(buf,sVar10,(size_t *)local_88," [%d,%+d]",(ulong)(uint)(int)iVar6,wVar9);
      pcVar15 = local_88[0];
      goto LAB_00182fc4;
    }
    pcVar15 = local_88[0];
    if (poVar13->to_a == 0) goto LAB_00182fc4;
    pcVar15 = " [%+d]";
  }
  strnfcat(buf,sVar10,(size_t *)local_88,pcVar15);
  pcVar15 = local_88[0];
LAB_00182fc4:
  if ((mode & 2) != 0) {
    poVar13 = obj->known;
    local_a0 = pcVar15;
    local_88[6] = (char *)0x0;
    local_88[7] = (char *)0x0;
    local_88[4] = (char *)0x0;
    local_88[5] = (char *)0x0;
    local_88[2] = (char *)0x0;
    local_88[3] = (char *)0x0;
    local_48 = 0;
    local_88[0] = (char *)0x0;
    local_88[1] = (char *)0x0;
    uVar16 = 0;
    for (lVar14 = 0; lVar14 != 0x11; lVar14 = lVar14 + 1) {
      sVar1 = poVar13->modifiers[lVar14];
      uVar19 = (uint)sVar1;
      if (sVar1 != 0) {
        if (uVar16 == 0) {
          local_88[0] = (char *)(ulong)uVar19;
          uVar16 = 1;
        }
        else {
          uVar20 = 0;
          if (0 < (int)uVar16) {
            uVar20 = (ulong)uVar16;
          }
          for (uVar22 = 0; uVar20 != uVar22; uVar22 = uVar22 + 1) {
            if (*(uint *)((long)local_88 + uVar22 * 4) == uVar19) {
              uVar20 = uVar22 & 0xffffffff;
              break;
            }
          }
          if ((uint)uVar20 == uVar16) {
            lVar21 = (long)(int)uVar16;
            uVar16 = uVar16 + 1;
            *(uint *)((long)local_88 + lVar21 * 4) = uVar19;
          }
        }
      }
    }
    if (uVar16 != 0) {
      strnfcat(buf,sVar10,(size_t *)&local_a0," <");
      max_00 = local_38;
      uVar20 = (ulong)uVar16;
      if ((int)uVar16 < 1) {
        uVar20 = 0;
      }
      for (uVar22 = 0; sVar10 = local_38, uVar20 != uVar22; uVar22 = uVar22 + 1) {
        if (uVar22 != 0) {
          strnfcat(buf,max_00,(size_t *)&local_a0,", ");
        }
        strnfcat(buf,max_00,(size_t *)&local_a0,"%+d",(ulong)*(uint *)((long)local_88 + uVar22 * 4))
        ;
      }
      strnfcat(buf,local_38,(size_t *)&local_a0,">");
    }
    local_88[0] = local_a0;
    _Var3 = object_flavor_is_aware(obj);
    if (((mode & 4) == 0 && !_Var3) || (_Var3 = tval_can_have_charges(obj), !_Var3)) {
      if (0 < obj->timeout) {
        _Var3 = tval_is_rod(obj);
        if ((_Var3) && (1 < obj->number)) {
          wVar7 = number_charging(obj);
          strnfcat(buf,sVar10,(size_t *)local_88," (%d charging)",(ulong)(uint)wVar7);
        }
        else {
          _Var3 = tval_is_rod(obj);
          if ((_Var3) || ((obj->activation != (activation *)0x0 || (obj->effect != (effect *)0x0))))
          {
            strnfcat(buf,sVar10,(size_t *)local_88," (charging)");
          }
        }
      }
    }
    else {
      pcVar15 = "s";
      if ((int)obj->pval == 1) {
        pcVar15 = "";
      }
      strnfcat(buf,sVar10,(size_t *)local_88," (%d charge%s)",(ulong)(uint)(int)obj->pval,pcVar15);
    }
    pcVar15 = local_88[0];
    if ((mode & 4) == 0) {
      local_a0 = local_88[0];
      local_88[4] = (char *)0x0;
      local_88[5] = (char *)0x0;
      local_88[2] = (char *)0x0;
      local_88[3] = (char *)0x0;
      local_88[0] = (char *)0x0;
      local_88[1] = (char *)0x0;
      bVar24 = obj->note != 0;
      if (bVar24) {
        local_88[0] = quark_str(obj->note);
      }
      uVar20 = (ulong)bVar24;
      _Var3 = object_flavor_is_aware(obj);
      ppVar17 = local_98;
      if (!_Var3) {
        _Var3 = tval_can_have_charges(obj);
        ppVar17 = local_98;
        uVar22 = uVar20;
        if ((_Var3) && (obj->pval == 0)) {
          uVar22 = (ulong)(bVar24 + 1);
          local_88[uVar20] = "empty";
        }
        _Var3 = object_flavor_was_tried(obj);
        uVar20 = uVar22;
        if (_Var3) {
          uVar20 = (ulong)((int)uVar22 + 1);
          local_88[uVar22] = "tried";
        }
      }
      uVar22 = uVar20;
      if (obj->known->curses != (curse_data *)0x0) {
        uVar22 = (ulong)((int)uVar20 + 1);
        local_88[uVar20] = "cursed";
      }
      uVar20 = uVar22;
      if ((ppVar17 != (player *)0x0) && (_Var3 = ignore_item_ok(ppVar17,obj), _Var3)) {
        uVar20 = (ulong)((int)uVar22 + 1);
        local_88[uVar22] = "ignore";
      }
      _Var3 = object_runes_known(obj);
      uVar16 = (uint)uVar20;
      if ((_Var3) || ((obj->known->notice & 2) == 0)) {
        if (uVar16 == 0) {
          return (size_t)pcVar15;
        }
      }
      else {
        uVar16 = uVar16 + 1;
        local_88[uVar20] = "??";
      }
      for (uVar20 = 0; uVar16 != uVar20; uVar20 = uVar20 + 1) {
        if (uVar20 == 0) {
          strnfcat(buf,sVar10,(size_t *)&local_a0," {");
        }
        strnfcat(buf,sVar10,(size_t *)&local_a0,"%s",local_88[uVar20]);
        if (uVar20 < uVar16 - 1) {
          strnfcat(buf,sVar10,(size_t *)&local_a0,", ");
        }
      }
      pcVar15 = "}";
      end = &local_a0;
    }
    else {
      _Var3 = object_flavor_is_aware(obj);
      if (_Var3) {
        _Var3 = object_runes_known(obj);
        if (_Var3) {
          if (obj->known->curses == (curse_data *)0x0) {
            return (size_t)pcVar15;
          }
          pcVar15 = " {cursed}";
        }
        else {
          pcVar15 = " {??}";
        }
      }
      else {
        pcVar15 = " {unseen}";
      }
      end = local_88;
    }
    strnfcat(buf,sVar10,(size_t *)end,pcVar15);
    pcVar15 = *end;
  }
  return (size_t)pcVar15;
}

Assistant:

size_t object_desc(char *buf, size_t max, const struct object *obj,
		uint32_t mode, const struct player *p)
{
	bool prefix = mode & ODESC_PREFIX ? true : false;
	bool spoil = mode & ODESC_SPOIL ? true : false;
	bool terse = mode & ODESC_TERSE ? true : false;

	size_t end = 0;

	/* Simple description for null item */
	if (!obj || !obj->known)
		return strnfmt(buf, max, "(nothing)");

	/* Unknown itema and cash get straightforward descriptions */
	if (obj->known && obj->kind != obj->known->kind) {
		if (prefix)
			return strnfmt(buf, max, "an unknown item");
		return strnfmt(buf, max, "unknown item");
	}

	if (tval_is_money(obj))
		return strnfmt(buf, max, "%d gold pieces worth of %s%s",
				obj->pval, obj->kind->name,
				ignore_item_ok(p, obj) ? " {ignore}" : "");

	/* Egos and kinds whose name we know are seen */
	if (obj->known->ego && !spoil)
		obj->ego->everseen = true;

	if (object_flavor_is_aware(obj) && !spoil)
		obj->kind->everseen = true;

	/** Construct the name **/

	/* Copy the base name to the buffer */
	end = obj_desc_name(buf, max, end, obj, prefix, mode, terse, p);

	/* Combat properties */
	if (mode & ODESC_COMBAT) {
		if (tval_is_chest(obj))
			end = obj_desc_chest(obj, buf, max, end);
		else if (tval_is_light(obj))
			end = obj_desc_light(obj, buf, max, end);

		end = obj_desc_combat(obj->known, buf, max, end, mode, p);
	}

	/* Modifiers, charges, flavour details, inscriptions */
	if (mode & ODESC_EXTRA) {
		end = obj_desc_mods(obj->known, buf, max, end);

		end = obj_desc_charges(obj, buf, max, end, mode);

		if (mode & ODESC_STORE)
			end = obj_desc_aware(obj, buf, max, end);
		else
			end = obj_desc_inscrip(obj, buf, max, end, p);
	}

	return end;
}